

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

Err * vm_run(VM *vm,int fn_idx,int ins_idx)

{
  double *pdVar1;
  byte bVar2;
  Value *pVVar3;
  Value *pVVar4;
  uint uVar5;
  int iVar6;
  Err *pEVar7;
  undefined4 extraout_var;
  ulong uVar8;
  BcIns *pBVar9;
  void **ppvVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  uint8_t loop_iter_count [1024];
  byte local_438 [1032];
  
  memset(local_438,0,0x400);
  pVVar3 = vm->consts;
  pVVar4 = vm->stack;
  pBVar9 = vm->fns[fn_idx].ins;
  fn_dump(vm->fns + fn_idx);
  ppvVar10 = (void **)&vm_run::interpreter_dispatch;
  uVar5 = *pBVar9;
  switch(uVar5 & 0xff) {
  case 0:
    uVar8 = pVVar4[uVar5 >> 0x10];
    goto LAB_001029b9;
  case 1:
    uVar8 = pVVar3[uVar5 >> 0x10];
    goto LAB_001029b9;
  case 2:
    uVar8 = (ulong)(uVar5 >> 0x10) | 0x7ffc000000010000;
    goto LAB_001029b9;
  case 3:
    uVar8 = (ulong)(uVar5 >> 0x10) + 0x7ffc000000020000;
LAB_001029b9:
    pVVar4[uVar5 >> 8 & 0xff] = uVar8;
    goto LAB_001029c0;
  case 4:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8)) +
             (double)pVVar4[uVar5 >> 0x18];
    break;
  case 5:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8)) +
             (double)pVVar3[uVar5 >> 0x18];
    break;
  case 6:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102e23;
  case 7:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8)) -
             (double)pVVar3[uVar5 >> 0x18];
    break;
  case 8:
    dVar13 = *(double *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
LAB_00102e23:
    dVar13 = dVar13 - (double)pVVar4[uVar5 >> 0x18];
    break;
  case 9:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8)) *
             (double)pVVar4[uVar5 >> 0x18];
    break;
  case 10:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8)) *
             (double)pVVar3[uVar5 >> 0x18];
    break;
  case 0xb:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102cb3;
  case 0xc:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8)) /
             (double)pVVar3[uVar5 >> 0x18];
    break;
  case 0xd:
    dVar13 = *(double *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
LAB_00102cb3:
    dVar13 = dVar13 / (double)pVVar4[uVar5 >> 0x18];
    break;
  case 0xe:
    pVVar4[uVar5 >> 8 & 0xff] = pVVar4[uVar5 >> 0x10] ^ 0x8000000000000000;
    goto LAB_001029c0;
  case 0xf:
    bVar12 = pVVar4[uVar5 >> 8 & 0xff] == *(Value *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102f0a;
  case 0x10:
    bVar12 = pVVar4[uVar5 >> 8 & 0xff] == *(Value *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102f0a;
  case 0x11:
    bVar12 = pVVar4[uVar5 >> 8 & 0xff] == ((ulong)(uVar5 >> 0x10 & 0xff) | 0x7ffc000000010000);
LAB_00102f0a:
    bVar12 = !bVar12;
    goto LAB_00102f0d;
  case 0x12:
    bVar12 = pVVar4[uVar5 >> 8 & 0xff] == *(Value *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102f0d;
  case 0x13:
    bVar12 = pVVar4[uVar5 >> 8 & 0xff] == *(Value *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102f0d;
  case 0x14:
    bVar12 = pVVar4[uVar5 >> 8 & 0xff] == ((ulong)(uVar5 >> 0x10 & 0xff) | 0x7ffc000000010000);
LAB_00102f0d:
    pBVar9 = pBVar9 + bVar12;
    goto LAB_001029c0;
  case 0x15:
    bVar12 = (double)pVVar4[uVar5 >> 8 & 0xff] <
             *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102f3e;
  case 0x16:
    bVar12 = (double)pVVar4[uVar5 >> 8 & 0xff] <
             *(double *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
LAB_00102f3e:
    bVar12 = !bVar12;
LAB_00102f41:
    pBVar9 = pBVar9 + bVar12;
    goto LAB_001029c0;
  case 0x17:
    pdVar1 = (double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    bVar12 = (double)pVVar4[uVar5 >> 8 & 0xff] == *pdVar1;
    bVar11 = (double)pVVar4[uVar5 >> 8 & 0xff] < *pdVar1;
    goto LAB_00102e81;
  case 0x18:
    pdVar1 = (double *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
    bVar12 = (double)pVVar4[uVar5 >> 8 & 0xff] == *pdVar1;
    bVar11 = (double)pVVar4[uVar5 >> 8 & 0xff] < *pdVar1;
LAB_00102e81:
    bVar12 = !bVar11 && !bVar12;
    goto LAB_00102f41;
  case 0x19:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102ea8;
  case 0x1a:
    dVar13 = *(double *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
LAB_00102ea8:
    bVar12 = (double)pVVar4[uVar5 >> 8 & 0xff] <= dVar13;
LAB_00102eb3:
    pBVar9 = pBVar9 + bVar12;
    goto LAB_001029c0;
  case 0x1b:
    dVar13 = *(double *)((long)pVVar4 + (ulong)(uVar5 >> 0xd & 0x7f8));
    goto LAB_00102e4d;
  case 0x1c:
    dVar13 = *(double *)((long)pVVar3 + (ulong)(uVar5 >> 0xd & 0x7f8));
LAB_00102e4d:
    bVar12 = (double)pVVar4[uVar5 >> 8 & 0xff] <= dVar13 &&
             dVar13 != (double)pVVar4[uVar5 >> 8 & 0xff];
    goto LAB_00102eb3;
  case 0x1d:
    goto LAB_00102df0;
  case 0x1e:
    uVar5 = (uint)((ulong)pBVar9 >> 2) & 0x3ff;
    bVar2 = local_438[uVar5];
    local_438[uVar5] = bVar2 + 1;
    if (0x31 < (byte)(bVar2 + 1)) {
      local_438[uVar5] = 0;
      jit_trace_new(vm);
      ppvVar10 = vm_run::jit_dispatch;
    }
LAB_00102df0:
    pBVar9 = pBVar9 + ((ulong)(*pBVar9 >> 8) - 0x800000);
    goto LAB_001029c0;
  case 0x1f:
    jit_rec_RET((Trace *)0x0,uVar5);
  case 0x20:
    iVar6 = printf("First stack slot %g\n",*pVVar4);
    return (Err *)CONCAT44(extraout_var,iVar6);
  }
  pVVar4[uVar5 >> 8 & 0xff] = (Value)dVar13;
LAB_001029c0:
  pEVar7 = (Err *)(*(code *)ppvVar10[pBVar9[1] & 0xff])();
  return pEVar7;
}

Assistant:

static Err * vm_run(VM *vm, int fn_idx, int ins_idx) {
	// Dispatch table when we're running the regular interpreter without a JIT
	// trace
	static void *interpreter_dispatch[] = {
		// Stores
		&&op_MOV, &&op_SET_N, &&op_SET_P, &&op_SET_F,

		// Arithmetic operators
		&&op_ADD_LL, &&op_ADD_LN, &&op_SUB_LL, &&op_SUB_LN, &&op_SUB_NL,
		&&op_MUL_LL, &&op_MUL_LN, &&op_DIV_LL, &&op_DIV_LN, &&op_DIV_NL,
		&&op_NEG,

		// Relational operators
		&&op_EQ_LL, &&op_EQ_LN, &&op_EQ_LP, &&op_NEQ_LL, &&op_NEQ_LN,
		&&op_NEQ_LP, &&op_LT_LL, &&op_LT_LN, &&op_LE_LL, &&op_LE_LN,
		&&op_GT_LL, &&op_GT_LN, &&op_GE_LL, &&op_GE_LN,

		// Control flow
		&&op_JMP, &&op_LOOP, &&op_CALL, &&op_RET,
	};

	// Dispatch table for when we're running a JIT trace
	static void *jit_dispatch[] = {
		// Stores
		&&jit_MOV, &&jit_SET_N, &&jit_SET_P, &&jit_SET_F,

		// Arithmetic operators
		&&jit_ADD_LL, &&jit_ADD_LN, &&jit_SUB_LL, &&jit_SUB_LN, &&jit_SUB_NL,
		&&jit_MUL_LL, &&jit_MUL_LN, &&jit_DIV_LL, &&jit_DIV_LN, &&jit_DIV_NL,
		&&jit_NEG,

		// Relational operators
		&&jit_EQ_LL, &&jit_EQ_LN, &&jit_EQ_LP, &&jit_NEQ_LL, &&jit_NEQ_LN,
		&&jit_NEQ_LP, &&jit_LT_LL, &&jit_LT_LN, &&jit_LE_LL, &&jit_LE_LN,
		&&jit_GT_LL, &&jit_GT_LN, &&jit_GE_LL, &&jit_GE_LN,

		// Control flow
		&&jit_JMP, &&jit_LOOP, &&jit_CALL, &&jit_RET,
	};

	// The current dispatch table. This determines whether we jump to the normal
	// `op_XXX` instructions, or the special `jit_XXX` instructions. We swap
	// dispatch tables when we want to start a JIT trace, and swap them back 
	// when we want to end it.
	void **dispatch = interpreter_dispatch;

	// Loop iteration table, which keeps track of how many iterations each loop
	// has completed so far. When the number of iterations hits the threshold, 
	// we start a JIT trace
	#define ITER_TABLE_SIZE 1024
	uint8_t loop_iter_count[ITER_TABLE_SIZE] = {0};

	// Information about the current JIT trace that we're recording.
	Trace *trace = NULL;

	// Move some variables into the function's local scope
	Value *k = vm->consts;
	Value *stk = vm->stack;

	// Move some important state information into local variables for easy
	// access
	Function *fn = &vm->fns[fn_idx]; // Currently executing function
	BcIns *ip = &fn->ins[ins_idx];   // Current instruction
	Err *err = NULL;                 // Most recent error
	fn_dump(fn);

	// Some helpful macros to reduce repetition
#define OPCODE(mnemonic)                 \
	jit_##mnemonic:                      \
		jit_rec_##mnemonic(trace, *ip); \
	op_##mnemonic:
#define DISPATCH() goto *dispatch[bc_op(*ip)]
#define NEXT() goto *dispatch[bc_op(*(++ip))]

	// Execute the first instruction
	DISPATCH();


	// ---- Storage -----------------------------------------------------------

OPCODE(MOV)
	stk[bc_arg1(*ip)] = stk[bc_arg16(*ip)];
	NEXT();
OPCODE(SET_N)
	stk[bc_arg1(*ip)] = k[bc_arg16(*ip)];
	NEXT();
OPCODE(SET_P)
	stk[bc_arg1(*ip)] = TAG_PRIM | bc_arg16(*ip);
	NEXT();
OPCODE(SET_F)
	stk[bc_arg1(*ip)] = TAG_FN | bc_arg16(*ip);
	NEXT();


	// ---- Arithmetic Operations ---------------------------------------------

#define BC_ARITH(name, operation)                      \
	OPCODE(name##_LL) {                                \
		double left = v2n(stk[bc_arg2(*ip)]);          \
		double right = v2n(stk[bc_arg3(*ip)]);         \
		stk[bc_arg1(*ip)] = n2v(left operation right); \
		NEXT();                                        \
	}                                                  \
	OPCODE(name##_LN) {                                \
		double left = v2n(stk[bc_arg2(*ip)]);          \
		double right = v2n(k[bc_arg3(*ip)]);           \
		stk[bc_arg1(*ip)] = n2v(left operation right); \
		NEXT();                                        \
	}

#define BC_ARITH_NON_COMMUTATIVE(name, operation)      \
	BC_ARITH(name, operation)                          \
	OPCODE(name##_NL) {                                \
		double left = v2n(k[bc_arg2(*ip)]);            \
		double right = v2n(stk[bc_arg3(*ip)]);         \
		stk[bc_arg1(*ip)] = n2v(left operation right); \
		NEXT();                                        \
	}

	BC_ARITH(ADD, +)
	BC_ARITH_NON_COMMUTATIVE(SUB, -)
	BC_ARITH(MUL, *)
	BC_ARITH_NON_COMMUTATIVE(DIV, /)

OPCODE(NEG)
	stk[bc_arg1(*ip)] = n2v(-v2n(stk[bc_arg16(*ip)]));
	NEXT();


	// ---- Relational Operators ----------------------------------------------

#define BC_EQ(name, op)                                               \
	OPCODE(name##_LL)                                                 \
		if (stk[bc_arg1(*ip)] op stk[bc_arg2(*ip)]) { ip++; }         \
		NEXT();                                                       \
	OPCODE(name##_LN)                                                 \
		if (stk[bc_arg1(*ip)] op k[bc_arg2(*ip)]) { ip++; }           \
		NEXT();                                                       \
	OPCODE(name##_LP)                                                 \
		if (stk[bc_arg1(*ip)] op (TAG_PRIM | bc_arg2(*ip))) { ip++; } \
		NEXT();

	// We invert the condition because we want to skip the following JMP only
	// if the condition turns out to be false - we want to take the JMP if the
	// condition is true
	BC_EQ(EQ, !=)
	BC_EQ(NEQ, ==)

#define BC_ORD(name, op)                                                \
	OPCODE(name##_LL)                                                   \
		if (v2n(stk[bc_arg1(*ip)]) op v2n(stk[bc_arg2(*ip)])) { ip++; } \
		NEXT();                                                         \
	OPCODE(name##_LN)                                                   \
		if (v2n(stk[bc_arg1(*ip)]) op v2n(k[bc_arg2(*ip)])) { ip++; }   \
		NEXT();

	// Invert the conditions, for the reason given above
	BC_ORD(LT, >=)
	BC_ORD(LE, >)
	BC_ORD(GT, <=)
	BC_ORD(GE, <)


	// ---- Control Flow ------------------------------------------------------

	// Halt the JIT trace when we reach the end of the loop we're JITing
jit_LOOP:
	jit_rec_finish(trace);
	dispatch = interpreter_dispatch;
	goto finish; // TODO

	// Hot loop detection is pretty simple. If a loop is executed more than 50
	// times, start a JIT trace. We keep track of loop iteration counts using
	// the instruction pointer as an index to a table. We reduce the resolution
	// of the table by bit-shifting the IP left by 2, and modulo-ing the pointer
	// by the size of the table. We don't really care about the high collision
	// rate this might cause.
op_LOOP: {
	size_t idx = (((uintptr_t) ip) >> 2) & (ITER_TABLE_SIZE - 1);
	loop_iter_count[idx]++;
	if (loop_iter_count[idx] >= JIT_THRESHOLD) {
		// Reset the iteration count
		loop_iter_count[idx] = 0;

		// Create a new trace (we only ever create one trace at the moment, so
		// don't worry about freeing any previous trace)
		trace = jit_trace_new(vm);

		// Start the JIT trace by swapping out the dispatch table
		dispatch = jit_dispatch;
	}
}

	// We don't bother JITing JMPs, we just follow them wherever they go and
	// record the next instruction. Guards are added only when we enounter the
	// above conditional instructions
jit_JMP:
op_JMP:
	ip += (int32_t) bc_arg24(*ip) - JMP_BIAS;
	NEXT();

OPCODE(CALL) // TODO
OPCODE(RET)  // TODO
	// Fall through to finish for now...

finish:
	// Termination
	printf("First stack slot %g\n", v2n(stk[0]));
	return err;
}